

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QObject_const*,QStyleAnimation*>::emplace<QStyleAnimation*const&>
          (QHash<QObject_const*,QStyleAnimation*> *this,QObject **key,QStyleAnimation **args)

{
  QStyleAnimation *pQVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<const_QObject_*,_QStyleAnimation_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QStyleAnimation **)this;
  if (pQVar1 == (QStyleAnimation *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if (*(uint *)pQVar1 < 2) {
      uVar2._0_4_ = pQVar1->_delay;
      uVar2._4_4_ = pQVar1->_duration;
      if (*(ulong *)&pQVar1->field_0x8 < uVar2 >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<QStyleAnimation*const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar3 = (piter)emplace_helper<QStyleAnimation*>(this,key,(QStyleAnimation **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_0032cc30;
    }
    local_28.d = (Data *)pQVar1;
    if (*(uint *)pQVar1 != 0xffffffff) {
      LOCK();
      *(uint *)pQVar1 = *(uint *)pQVar1 + 1;
      UNLOCK();
    }
  }
  QHash<const_QObject_*,_QStyleAnimation_*>::detach
            ((QHash<const_QObject_*,_QStyleAnimation_*> *)this);
  pVar3 = (piter)emplace_helper<QStyleAnimation*const&>(this,key,args);
  QHash<const_QObject_*,_QStyleAnimation_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0032cc30:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }